

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.h
# Opt level: O2

void __thiscall gui::Widget::~Widget(Widget *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Widget() = default;